

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void wasm::
     ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
     ::scan(CodeFolding *self,Expression **currp)

{
  Expression *pEVar1;
  uint uVar2;
  Expression *curr;
  Expression **currp_local;
  CodeFolding *self_local;
  
  pEVar1 = *currp;
  uVar2 = (uint)pEVar1->_id;
  if ((uVar2 - 1 < 3) || (uVar2 == 0x34 || uVar2 == 0x35)) {
    Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>::pushTask
              ((Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                   ).
                   super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
               ,doPostVisitControlFlow,currp);
  }
  PostWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>::scan
            (self,currp);
  uVar2 = (uint)pEVar1->_id;
  if ((uVar2 - 1 < 3) || (uVar2 == 0x34 || uVar2 == 0x35)) {
    Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>::pushTask
              ((Walker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
                *)&(self->
                   super_WalkerPass<wasm::ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>_>
                   ).
                   super_ControlFlowWalker<wasm::CodeFolding,_wasm::UnifiedExpressionVisitor<wasm::CodeFolding,_void>_>
               ,doPreVisitControlFlow,currp);
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    auto* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId:
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doPostVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }

    PostWalker<SubType, VisitorType>::scan(self, currp);

    switch (curr->_id) {
      case Expression::Id::BlockId:
      case Expression::Id::IfId:
      case Expression::Id::LoopId:
      case Expression::Id::TryId:
      case Expression::Id::TryTableId: {
        self->pushTask(SubType::doPreVisitControlFlow, currp);
        break;
      }
      default: {
      }
    }
  }